

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_comparison_expression.cpp
# Opt level: O2

void duckdb::ExpressionBinder::TestCollation(ClientContext *context,string *collation)

{
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> local_80;
  string local_78;
  Value local_58;
  
  Value::Value(&local_58,anon_var_dwarf_4b71df5 + 9);
  make_uniq_base<duckdb::Expression,duckdb::BoundConstantExpression,duckdb::Value>
            ((duckdb *)&local_80,&local_58);
  Value::~Value(&local_58);
  ::std::__cxx11::string::string((string *)&local_78,(string *)collation);
  LogicalType::VARCHAR_COLLATION(&local_58.type_,&local_78);
  PushCollation(context,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&local_80,&local_58.type_,ALL_COLLATIONS);
  LogicalType::~LogicalType(&local_58.type_);
  ::std::__cxx11::string::~string((string *)&local_78);
  if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
      local_80._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)local_80._M_t.
                          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                          .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

void ExpressionBinder::TestCollation(ClientContext &context, const string &collation) {
	auto expr = make_uniq_base<Expression, BoundConstantExpression>(Value(""));
	PushCollation(context, expr, LogicalType::VARCHAR_COLLATION(collation));
}